

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O1

bool __thiscall flow::lang::Lexer::ipv6HexSeq(Lexer *this)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = ipv6HexDigit4(this);
  if (bVar1) {
    do {
      if (this->currentChar_ != 0x3a) {
        return true;
      }
      iVar2 = std::istream::peek();
      if (iVar2 == 0x3a) {
        return true;
      }
      std::__cxx11::string::push_back((char)this + -0x58);
      nextChar(this,true);
      bVar1 = ipv6HexDigit4(this);
    } while (bVar1);
  }
  return false;
}

Assistant:

bool Lexer::ipv6HexSeq() {
  if (!ipv6HexDigit4()) return false;

  while (currentChar() == ':' && peekChar() != ':') {
    stringValue_ += ':';
    nextChar();

    if (!ipv6HexDigit4()) return false;
  }

  return true;
}